

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test9::getMatrixMultiplicationResult
          (GPUShaderFP64Test9 *this,_variable_type *matrix_a_type,
          vector<double,_std::allocator<double>_> *matrix_a_data,_variable_type *matrix_b_type,
          vector<double,_std::allocator<double>_> *matrix_b_data,double *out_result_ptr)

{
  Matrix<double,_4,_4> *pMVar1;
  Matrix<double,_4,_4> *pMVar2;
  Matrix<double,_4,_4> *pMVar3;
  Matrix<double,_4,_4> *pMVar4;
  Matrix<double,_4,_4> *pMVar5;
  Matrix<double,_4,_4> *pMVar6;
  Matrix<double,_4,_4> *pMVar7;
  Matrix<double,_4,_4> *pMVar8;
  Matrix<double,_4,_4> *pMVar9;
  Matrix<double,_4,_4> *pMVar10;
  Matrix<double,_4,_4> *pMVar11;
  Matrix<double,_4,_3> *pMVar12;
  Matrix<double,_4,_4> *pMVar13;
  Matrix<double,_4,_4> *pMVar14;
  Matrix<double,_4,_4> *pMVar15;
  Matrix<double,_4,_4> *pMVar16;
  Matrix<double,_4,_4> *pMVar17;
  Matrix<double,_4,_4> *pMVar18;
  Matrix<double,_4,_4> *pMVar19;
  Matrix<double,_4,_4> *pMVar20;
  Matrix<double,_4,_4> *pMVar21;
  Matrix<double,_4,_4> *pMVar22;
  Matrix<double,_4,_4> *pMVar23;
  Vector<double,_4> *pVVar24;
  Matrix<double,_4,_4> *pMVar25;
  pointer pdVar26;
  Matrix<double,_4,_4> *pMVar27;
  double *pdVar28;
  double *pdVar29;
  TestError *this_00;
  Matrix<double,_4,_4> *pMVar30;
  Matrix<double,_4,_4> *pMVar31;
  Matrix<double,_4,_4> *pMVar32;
  Matrix<double,_4,_4> *pMVar33;
  Matrix<double,_4,_4> *pMVar34;
  Matrix<double,_4,_4> *pMVar35;
  Matrix<double,_4,_4> *pMVar36;
  Matrix<double,_4,_4> *pMVar37;
  Matrix<double,_4,_4> *pMVar38;
  Matrix<double,_4,_4> *pMVar39;
  Matrix<double,_4,_4> *pMVar40;
  Matrix<double,_4,_4> *pMVar41;
  Vector<double,_3> *pVVar42;
  long lVar43;
  double *pdVar44;
  undefined8 *puVar45;
  Matrix<double,_4,_4> *pMVar46;
  long lVar47;
  long lVar48;
  Matrix<double,_4,_4> *pMVar49;
  Matrix<double,_4,_4> *pMVar50;
  Matrix<double,_4,_4> *pMVar51;
  Matrix<double,_4,_4> *pMVar52;
  bool bVar53;
  byte bVar54;
  uint uVar55;
  Matrix2d matrix_b;
  Matrix<double,_2,_3> res_2;
  Matrix<double,_2,_2> res;
  Matrix2d matrix_a;
  Matrix<double,_2,_2> result_1;
  Matrix2d result;
  Matrix<double,_4,_4> local_2d8;
  Matrix<double,_4,_3> local_258;
  Matrix<double,_4,_3> local_1f8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  Matrix<double,_4,_4> local_178;
  Matrix<double,_3,_4> local_f8;
  double local_98 [17];
  
  bVar54 = 0;
  pMVar30 = &local_2d8;
  pMVar31 = &local_2d8;
  pMVar1 = &local_2d8;
  pMVar2 = &local_2d8;
  pMVar3 = &local_2d8;
  pMVar4 = &local_2d8;
  pMVar5 = &local_2d8;
  pMVar32 = &local_2d8;
  pMVar6 = &local_2d8;
  pMVar7 = &local_2d8;
  pMVar33 = &local_2d8;
  pMVar50 = &local_2d8;
  pMVar34 = &local_2d8;
  pMVar35 = &local_2d8;
  pMVar9 = &local_2d8;
  pMVar10 = &local_2d8;
  pMVar11 = &local_2d8;
  pMVar13 = &local_2d8;
  pMVar14 = &local_2d8;
  pMVar36 = &local_2d8;
  pMVar15 = &local_2d8;
  pMVar16 = &local_2d8;
  pMVar37 = &local_2d8;
  pMVar51 = &local_2d8;
  pMVar18 = &local_2d8;
  pMVar19 = &local_2d8;
  pMVar38 = &local_2d8;
  pMVar20 = &local_2d8;
  pMVar21 = &local_2d8;
  pMVar39 = &local_2d8;
  pMVar52 = &local_2d8;
  pMVar40 = &local_2d8;
  pMVar41 = &local_2d8;
  pMVar23 = &local_2d8;
  pMVar25 = &local_2d8;
  pMVar27 = &local_2d8;
  pMVar8 = &local_2d8;
  pMVar17 = &local_2d8;
  pMVar22 = &local_2d8;
  pMVar46 = &local_2d8;
  pMVar49 = &local_2d8;
  switch(*matrix_a_type) {
  case VARIABLE_TYPE_DMAT2:
    pdVar26 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (double *)&local_178;
    local_178.m_data.m_data[0].m_data[2] = 0.0;
    local_178.m_data.m_data[0].m_data[3] = 0.0;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 2) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      pdVar26 = pdVar26 + 2;
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar26 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar30 + lVar47 * 2) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      pdVar26 = pdVar26 + 2;
      pMVar30 = (Matrix<double,_4,_4> *)((long)pMVar30 + 8);
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = local_98;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 == 0x10);
      pdVar29 = pdVar29 + 1;
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 == 0x10);
      pdVar29 = pdVar29 + 1;
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    pdVar28 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47 * 2);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      pdVar29 = pdVar29 + 2;
      pdVar28 = pdVar28 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_178;
    pdVar28 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47);
        lVar47 = lVar47 + 0x10;
      } while (lVar47 == 0x10);
      pdVar29 = pdVar29 + 1;
      pdVar28 = pdVar28 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 == 0x10);
      pdVar29 = pdVar29 + 1;
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar31 + lVar47 * 2);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      pdVar29 = pdVar29 + 2;
      pMVar31 = (Matrix<double,_4,_4> *)((long)pMVar31 + 8);
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar1 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x10;
      } while (lVar47 == 0x10);
      pMVar1 = (Matrix<double,_4,_4> *)((long)pMVar1 + 8);
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    tcu::operator*((Matrix<double,_2,_2> *)pdVar29,(Matrix<double,_2,_2> *)&local_178,
                   (Matrix<double,_2,_2> *)&local_2d8);
    pdVar28 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar28 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x10;
      } while (lVar47 == 0x10);
      pdVar28 = pdVar28 + 1;
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pMVar12 = &local_1f8;
    pdVar29 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)(pMVar12->m_data).m_data[0].m_data + lVar47) =
             *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      pdVar29 = pdVar29 + 2;
      pMVar12 = (Matrix<double,_4,_3> *)((long)(pMVar12->m_data).m_data[0].m_data + lVar47);
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    local_258.m_data.m_data[0].m_data[0]._0_4_ = local_1f8.m_data.m_data[0].m_data[0]._0_4_;
    local_258.m_data.m_data[0].m_data[0]._4_4_ = local_1f8.m_data.m_data[0].m_data[0]._4_4_;
    local_258.m_data.m_data[0].m_data[1]._0_4_ = local_1f8.m_data.m_data[0].m_data[1]._0_4_;
    local_258.m_data.m_data[0].m_data[1]._4_4_ = local_1f8.m_data.m_data[0].m_data[1]._4_4_;
    local_258.m_data.m_data[0].m_data[2]._0_4_ = local_1f8.m_data.m_data[0].m_data[2]._0_4_;
    local_258.m_data.m_data[0].m_data[2]._4_4_ = local_1f8.m_data.m_data[0].m_data[2]._4_4_;
    local_258.m_data.m_data[0].m_data[3]._0_4_ = local_1f8.m_data.m_data[0].m_data[3]._0_4_;
    local_258.m_data.m_data[0].m_data[3]._4_4_ = local_1f8.m_data.m_data[0].m_data[3]._4_4_;
    goto LAB_00953770;
  case VARIABLE_TYPE_DMAT2X3:
    pdVar26 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = local_98;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 2) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      pdVar26 = pdVar26 + 3;
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 == 0x18);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar26 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (double *)&local_258;
    local_258.m_data.m_data[1].m_data[0] = 0.0;
    local_258.m_data.m_data[1].m_data[1] = 0.0;
    local_258.m_data.m_data[0].m_data[2] = 0.0;
    local_258.m_data.m_data[0].m_data[3] = 0.0;
    local_258.m_data.m_data[0].m_data[0] = 0.0;
    local_258.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar28 = pdVar29;
      do {
        *pdVar28 = pdVar26[lVar47];
        lVar47 = lVar47 + 1;
        pdVar28 = pdVar28 + 3;
      } while (lVar47 == 1);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 2;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_f8;
    local_f8.m_data.m_data[1].m_data[1] = 0.0;
    local_f8.m_data.m_data[1].m_data[2] = 0.0;
    local_f8.m_data.m_data[0].m_data[2] = 0.0;
    local_f8.m_data.m_data[1].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 != 0x30);
      pdVar29 = pdVar29 + 1;
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_178;
    local_178.m_data.m_data[1].m_data[2] = 0.0;
    local_178.m_data.m_data[1].m_data[3] = 0.0;
    local_178.m_data.m_data[1].m_data[0] = 0.0;
    local_178.m_data.m_data[1].m_data[1] = 0.0;
    local_178.m_data.m_data[0].m_data[2] = 0.0;
    local_178.m_data.m_data[0].m_data[3] = 0.0;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    local_178.m_data.m_data[2].m_data[0] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 != 0x48);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pMVar13 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 == 0x18);
      lVar47 = lVar47 + 1;
      pMVar13 = (Matrix<double,_4,_4> *)((long)pMVar13 + 8);
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar14 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47 * 2);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      pMVar14 = (Matrix<double,_4,_4> *)((long)pMVar14 + 0x18);
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar36 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 == 0x18);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pMVar36 = (Matrix<double,_4,_4> *)((long)pMVar36 + 8);
    } while (lVar43 != 3);
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pMVar15 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 != 0x30);
      pMVar15 = (Matrix<double,_4,_4> *)((long)pMVar15 + 8);
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_258;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar28 = pdVar29;
      do {
        *(double *)((long)pMVar16 + lVar47 * 8) = *pdVar28;
        lVar47 = lVar47 + 1;
        pdVar28 = pdVar28 + 3;
      } while (lVar47 == 1);
      lVar43 = lVar43 + 1;
      pMVar16 = (Matrix<double,_4,_4> *)((long)pMVar16 + 0x10);
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar37 + lVar47);
        lVar47 = lVar47 + 0x10;
      } while (lVar47 != 0x30);
      pdVar29 = pdVar29 + 1;
      pMVar37 = (Matrix<double,_4,_4> *)((long)pMVar37 + 8);
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    tcu::operator*((Matrix<double,_3,_3> *)&local_2d8,(Matrix<double,_3,_2> *)&local_1f8,
                   (Matrix<double,_2,_3> *)&local_f8);
    pdVar29 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar51 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 != 0x48);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pMVar51 = (Matrix<double,_4,_4> *)((long)pMVar51 + 8);
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar17 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 3;
      pMVar17 = (Matrix<double,_4,_4> *)((long)pMVar17 + 0x18);
    } while (lVar43 != 3);
    break;
  case VARIABLE_TYPE_DMAT2X4:
    pdVar26 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = local_98;
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 2) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      pdVar26 = pdVar26 + 4;
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[1].m_data[2] = 0.0;
    local_1f8.m_data.m_data[1].m_data[3] = 0.0;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 == 0x20);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pdVar26 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (double *)&local_258;
    local_258.m_data.m_data[1].m_data[2] = 0.0;
    local_258.m_data.m_data[1].m_data[3] = 0.0;
    local_258.m_data.m_data[1].m_data[0] = 0.0;
    local_258.m_data.m_data[1].m_data[1] = 0.0;
    local_258.m_data.m_data[0].m_data[2] = 0.0;
    local_258.m_data.m_data[0].m_data[3] = 0.0;
    local_258.m_data.m_data[0].m_data[0] = 0.0;
    local_258.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 4) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 2;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_f8;
    local_f8.m_data.m_data[2].m_data[0] = 0.0;
    local_f8.m_data.m_data[2].m_data[1] = 0.0;
    local_f8.m_data.m_data[1].m_data[1] = 0.0;
    local_f8.m_data.m_data[1].m_data[2] = 0.0;
    local_f8.m_data.m_data[0].m_data[2] = 0.0;
    local_f8.m_data.m_data[1].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 != 0x40);
      pdVar29 = pdVar29 + 1;
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_178;
    local_178.m_data.m_data[3].m_data[2] = 0.0;
    local_178.m_data.m_data[3].m_data[3] = 0.0;
    local_178.m_data.m_data[3].m_data[0] = 0.0;
    local_178.m_data.m_data[3].m_data[1] = 0.0;
    local_178.m_data.m_data[2].m_data[2] = 0.0;
    local_178.m_data.m_data[2].m_data[3] = 0.0;
    local_178.m_data.m_data[2].m_data[0] = 0.0;
    local_178.m_data.m_data[2].m_data[1] = 0.0;
    local_178.m_data.m_data[1].m_data[2] = 0.0;
    local_178.m_data.m_data[1].m_data[3] = 0.0;
    local_178.m_data.m_data[1].m_data[0] = 0.0;
    local_178.m_data.m_data[1].m_data[1] = 0.0;
    local_178.m_data.m_data[0].m_data[2] = 0.0;
    local_178.m_data.m_data[0].m_data[3] = 0.0;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 != 0x80);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    local_2d8.m_data.m_data[1].m_data[2] = 0.0;
    local_2d8.m_data.m_data[1].m_data[3] = 0.0;
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pMVar4 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 == 0x20);
      lVar47 = lVar47 + 1;
      pMVar4 = (Matrix<double,_4,_4> *)((long)pMVar4 + 8);
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pdVar29 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar5 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47 * 2);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      pMVar5 = (Matrix<double,_4,_4> *)((long)pMVar5 + 0x20);
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar32 + lVar47);
        lVar47 = lVar47 + 0x20;
      } while (lVar47 == 0x20);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pMVar32 = (Matrix<double,_4,_4> *)((long)pMVar32 + 8);
    } while (lVar43 != 4);
    local_2d8.m_data.m_data[1].m_data[2] = 0.0;
    local_2d8.m_data.m_data[1].m_data[3] = 0.0;
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pMVar6 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 != 0x40);
      pMVar6 = (Matrix<double,_4,_4> *)((long)pMVar6 + 8);
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_258;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar7 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47 * 4);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      lVar43 = lVar43 + 1;
      pMVar7 = (Matrix<double,_4,_4> *)((long)pMVar7 + 0x10);
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar33 + lVar47);
        lVar47 = lVar47 + 0x10;
      } while (lVar47 != 0x40);
      pdVar29 = pdVar29 + 1;
      pMVar33 = (Matrix<double,_4,_4> *)((long)pMVar33 + 8);
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    tcu::operator*(&local_2d8,(Matrix<double,_4,_2> *)&local_1f8,(Matrix<double,_2,_4> *)&local_f8);
    pdVar29 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar50 + lVar47);
        lVar47 = lVar47 + 0x20;
      } while (lVar47 != 0x80);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pMVar50 = (Matrix<double,_4,_4> *)((long)pMVar50 + 8);
    } while (lVar43 != 4);
    pVVar24 = (Vector<double,_4> *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar8 + lVar47) =
             *(undefined8 *)
              ((long)((Vector<tcu::Vector<double,_4>,_4> *)pVVar24->m_data)->m_data[0].m_data +
              lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      lVar43 = lVar43 + 1;
      pVVar24 = pVVar24 + 1;
      pMVar8 = (Matrix<double,_4,_4> *)((long)pMVar8 + 0x20);
    } while (lVar43 != 4);
    goto LAB_00954210;
  case VARIABLE_TYPE_DMAT3:
    pdVar26 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (double *)&local_178;
    local_178.m_data.m_data[1].m_data[2] = 0.0;
    local_178.m_data.m_data[1].m_data[3] = 0.0;
    local_178.m_data.m_data[1].m_data[0] = 0.0;
    local_178.m_data.m_data[1].m_data[1] = 0.0;
    local_178.m_data.m_data[0].m_data[2] = 0.0;
    local_178.m_data.m_data[0].m_data[3] = 0.0;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    local_178.m_data.m_data[2].m_data[0] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar28 = pdVar29;
      do {
        *pdVar28 = pdVar26[lVar47];
        lVar47 = lVar47 + 1;
        pdVar28 = pdVar28 + 3;
      } while (lVar47 != 3);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 3;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar26 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_2d8.m_data.m_data[1].m_data[2] = 0.0;
    local_2d8.m_data.m_data[1].m_data[3] = 0.0;
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    local_2d8.m_data.m_data[2].m_data[0] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar29 = (double *)pMVar34;
      do {
        *pdVar29 = pdVar26[lVar47];
        lVar47 = lVar47 + 1;
        pdVar29 = pdVar29 + 3;
      } while (lVar47 != 3);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 3;
      pMVar34 = (Matrix<double,_4,_4> *)((long)pMVar34 + 8);
    } while (lVar43 != 3);
    pdVar29 = local_98;
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    local_98[8] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 != 0x48);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[1].m_data[2] = 0.0;
    local_1f8.m_data.m_data[1].m_data[3] = 0.0;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    local_1f8.m_data.m_data[2].m_data[0] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 != 0x48);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = (double *)&local_1f8;
    pdVar28 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar44 = pdVar28;
      do {
        pdVar29[lVar47] = *pdVar44;
        lVar47 = lVar47 + 1;
        pdVar44 = pdVar44 + 3;
      } while (lVar47 != 3);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 3;
      pdVar28 = pdVar28 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_178;
    pdVar28 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 != 0x48);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pdVar28 = pdVar28 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[1].m_data[2] = 0.0;
    local_1f8.m_data.m_data[1].m_data[3] = 0.0;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    local_1f8.m_data.m_data[2].m_data[0] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 != 0x48);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      puVar45 = (undefined8 *)pMVar35;
      do {
        pdVar29[lVar47] = (double)*puVar45;
        lVar47 = lVar47 + 1;
        puVar45 = puVar45 + 3;
      } while (lVar47 != 3);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 3;
      pMVar35 = (Matrix<double,_4,_4> *)((long)pMVar35 + 8);
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar9 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 != 0x48);
      lVar43 = lVar43 + 1;
      pMVar9 = (Matrix<double,_4,_4> *)((long)pMVar9 + 8);
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_1f8;
    tcu::operator*((Matrix<double,_3,_3> *)pdVar29,(Matrix<double,_3,_3> *)&local_178,
                   (Matrix<double,_3,_3> *)&local_2d8);
    pdVar28 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar28 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 != 0x48);
      lVar43 = lVar43 + 1;
      pdVar28 = pdVar28 + 1;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_1f8;
    pdVar28 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      lVar43 = lVar43 + 1;
      pdVar28 = pdVar28 + 3;
      pdVar29 = pdVar29 + 3;
    } while (lVar43 != 3);
    pMVar49 = (Matrix<double,_4,_4> *)&local_1f8;
    break;
  case VARIABLE_TYPE_DMAT3X2:
    pdVar26 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (double *)&local_178;
    local_178.m_data.m_data[1].m_data[0] = 0.0;
    local_178.m_data.m_data[1].m_data[1] = 0.0;
    local_178.m_data.m_data[0].m_data[2] = 0.0;
    local_178.m_data.m_data[0].m_data[3] = 0.0;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar28 = pdVar29;
      do {
        *pdVar28 = pdVar26[lVar47];
        lVar47 = lVar47 + 1;
        pdVar28 = pdVar28 + 3;
      } while (lVar47 == 1);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 2;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pMVar2 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 != 0x30);
      pMVar2 = (Matrix<double,_4,_4> *)((long)pMVar2 + 8);
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar26 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = local_98;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 2) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      pdVar26 = pdVar26 + 3;
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 == 0x18);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = (double *)&local_f8;
    local_f8.m_data.m_data[0].m_data[2] = 0.0;
    local_f8.m_data.m_data[1].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 == 0x10);
      pdVar29 = pdVar29 + 1;
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_258;
    local_258.m_data.m_data[1].m_data[0] = 0.0;
    local_258.m_data.m_data[1].m_data[1] = 0.0;
    local_258.m_data.m_data[0].m_data[2] = 0.0;
    local_258.m_data.m_data[0].m_data[3] = 0.0;
    local_258.m_data.m_data[0].m_data[0] = 0.0;
    local_258.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 != 0x30);
      pdVar29 = pdVar29 + 1;
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_258;
    pdVar28 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar44 = pdVar28;
      do {
        pdVar29[lVar47] = *pdVar44;
        lVar47 = lVar47 + 1;
        pdVar44 = pdVar44 + 3;
      } while (lVar47 == 1);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 2;
      pdVar28 = pdVar28 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_258;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar3 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x10;
      } while (lVar47 != 0x30);
      pMVar3 = (Matrix<double,_4,_4> *)((long)pMVar3 + 8);
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_258;
    local_258.m_data.m_data[1].m_data[0] = 0.0;
    local_258.m_data.m_data[1].m_data[1] = 0.0;
    local_258.m_data.m_data[0].m_data[2] = 0.0;
    local_258.m_data.m_data[0].m_data[3] = 0.0;
    local_258.m_data.m_data[0].m_data[0] = 0.0;
    local_258.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 == 0x18);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = (double *)&local_258;
    pdVar28 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47 * 2);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      pdVar29 = pdVar29 + 3;
      pdVar28 = pdVar28 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    pdVar28 = (double *)&local_258;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 == 0x18);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pdVar28 = pdVar28 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_258;
    tcu::operator*((Matrix<double,_2,_2> *)pdVar29,(Matrix<double,_2,_3> *)&local_2d8,
                   (Matrix<double,_3,_2> *)&local_1f8);
    pdVar28 = (double *)&local_f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar28 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x10;
      } while (lVar47 == 0x10);
      pdVar28 = pdVar28 + 1;
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pMVar12 = &local_258;
    pdVar29 = (double *)&local_f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)(pMVar12->m_data).m_data[0].m_data + lVar47) =
             *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      pdVar29 = pdVar29 + 2;
      pMVar12 = (Matrix<double,_4,_3> *)((long)(pMVar12->m_data).m_data[0].m_data + lVar47);
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    goto LAB_00953760;
  case VARIABLE_TYPE_DMAT3X4:
    pdVar26 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = local_98;
    local_98[10] = 0.0;
    local_98[0xb] = 0.0;
    local_98[8] = 0.0;
    local_98[9] = 0.0;
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar28 = pdVar29;
      do {
        *pdVar28 = pdVar26[lVar47];
        lVar47 = lVar47 + 1;
        pdVar28 = pdVar28 + 3;
      } while (lVar47 != 4);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 4;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[2].m_data[2] = 0.0;
    local_1f8.m_data.m_data[2].m_data[3] = 0.0;
    local_1f8.m_data.m_data[2].m_data[0] = 0.0;
    local_1f8.m_data.m_data[2].m_data[1] = 0.0;
    local_1f8.m_data.m_data[1].m_data[2] = 0.0;
    local_1f8.m_data.m_data[1].m_data[3] = 0.0;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 != 0x60);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pdVar26 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (double *)&local_258;
    local_258.m_data.m_data[2].m_data[2] = 0.0;
    local_258.m_data.m_data[2].m_data[3] = 0.0;
    local_258.m_data.m_data[2].m_data[0] = 0.0;
    local_258.m_data.m_data[2].m_data[1] = 0.0;
    local_258.m_data.m_data[1].m_data[2] = 0.0;
    local_258.m_data.m_data[1].m_data[3] = 0.0;
    local_258.m_data.m_data[1].m_data[0] = 0.0;
    local_258.m_data.m_data[1].m_data[1] = 0.0;
    local_258.m_data.m_data[0].m_data[2] = 0.0;
    local_258.m_data.m_data[0].m_data[3] = 0.0;
    local_258.m_data.m_data[0].m_data[0] = 0.0;
    local_258.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 4) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 3;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_f8;
    local_f8.m_data.m_data[3].m_data[1] = 0.0;
    local_f8.m_data.m_data[3].m_data[2] = 0.0;
    local_f8.m_data.m_data[2].m_data[2] = 0.0;
    local_f8.m_data.m_data[3].m_data[0] = 0.0;
    local_f8.m_data.m_data[2].m_data[0] = 0.0;
    local_f8.m_data.m_data[2].m_data[1] = 0.0;
    local_f8.m_data.m_data[1].m_data[1] = 0.0;
    local_f8.m_data.m_data[1].m_data[2] = 0.0;
    local_f8.m_data.m_data[0].m_data[2] = 0.0;
    local_f8.m_data.m_data[1].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 != 0x60);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = (double *)&local_178;
    local_178.m_data.m_data[3].m_data[2] = 0.0;
    local_178.m_data.m_data[3].m_data[3] = 0.0;
    local_178.m_data.m_data[3].m_data[0] = 0.0;
    local_178.m_data.m_data[3].m_data[1] = 0.0;
    local_178.m_data.m_data[2].m_data[2] = 0.0;
    local_178.m_data.m_data[2].m_data[3] = 0.0;
    local_178.m_data.m_data[2].m_data[0] = 0.0;
    local_178.m_data.m_data[2].m_data[1] = 0.0;
    local_178.m_data.m_data[1].m_data[2] = 0.0;
    local_178.m_data.m_data[1].m_data[3] = 0.0;
    local_178.m_data.m_data[1].m_data[0] = 0.0;
    local_178.m_data.m_data[1].m_data[1] = 0.0;
    local_178.m_data.m_data[0].m_data[2] = 0.0;
    local_178.m_data.m_data[0].m_data[3] = 0.0;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 != 0x80);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    local_2d8.m_data.m_data[2].m_data[2] = 0.0;
    local_2d8.m_data.m_data[2].m_data[3] = 0.0;
    local_2d8.m_data.m_data[2].m_data[0] = 0.0;
    local_2d8.m_data.m_data[2].m_data[1] = 0.0;
    local_2d8.m_data.m_data[1].m_data[2] = 0.0;
    local_2d8.m_data.m_data[1].m_data[3] = 0.0;
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pMVar18 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 != 0x60);
      lVar47 = lVar47 + 1;
      pMVar18 = (Matrix<double,_4,_4> *)((long)pMVar18 + 8);
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pdVar29 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar28 = pdVar29;
      do {
        *(double *)((long)pMVar19 + lVar47 * 8) = *pdVar28;
        lVar47 = lVar47 + 1;
        pdVar28 = pdVar28 + 3;
      } while (lVar47 != 4);
      lVar43 = lVar43 + 1;
      pMVar19 = (Matrix<double,_4,_4> *)((long)pMVar19 + 0x20);
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar38 + lVar47);
        lVar47 = lVar47 + 0x20;
      } while (lVar47 != 0x60);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pMVar38 = (Matrix<double,_4,_4> *)((long)pMVar38 + 8);
    } while (lVar43 != 4);
    local_2d8.m_data.m_data[2].m_data[2] = 0.0;
    local_2d8.m_data.m_data[2].m_data[3] = 0.0;
    local_2d8.m_data.m_data[2].m_data[0] = 0.0;
    local_2d8.m_data.m_data[2].m_data[1] = 0.0;
    local_2d8.m_data.m_data[1].m_data[2] = 0.0;
    local_2d8.m_data.m_data[1].m_data[3] = 0.0;
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pMVar20 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 != 0x60);
      lVar47 = lVar47 + 1;
      pMVar20 = (Matrix<double,_4,_4> *)((long)pMVar20 + 8);
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = (double *)&local_258;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar21 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47 * 4);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      lVar43 = lVar43 + 1;
      pMVar21 = (Matrix<double,_4,_4> *)((long)pMVar21 + 0x18);
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar39 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 != 0x60);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pMVar39 = (Matrix<double,_4,_4> *)((long)pMVar39 + 8);
    } while (lVar43 != 3);
    tcu::operator*(&local_2d8,&local_1f8,&local_f8);
    pdVar29 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pMVar52 + lVar47);
        lVar47 = lVar47 + 0x20;
      } while (lVar47 != 0x80);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pMVar52 = (Matrix<double,_4,_4> *)((long)pMVar52 + 8);
    } while (lVar43 != 4);
    pVVar24 = (Vector<double,_4> *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar22 + lVar47) =
             *(undefined8 *)
              ((long)((Vector<tcu::Vector<double,_4>,_4> *)pVVar24->m_data)->m_data[0].m_data +
              lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      lVar43 = lVar43 + 1;
      pVVar24 = pVVar24 + 1;
      pMVar22 = (Matrix<double,_4,_4> *)((long)pMVar22 + 0x20);
      pMVar46 = &local_2d8;
    } while (lVar43 != 4);
    goto LAB_00954210;
  case VARIABLE_TYPE_DMAT4:
    pdVar26 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (double *)&local_178;
    local_178.m_data.m_data[3].m_data[2] = 0.0;
    local_178.m_data.m_data[3].m_data[3] = 0.0;
    local_178.m_data.m_data[3].m_data[0] = 0.0;
    local_178.m_data.m_data[3].m_data[1] = 0.0;
    local_178.m_data.m_data[2].m_data[2] = 0.0;
    local_178.m_data.m_data[2].m_data[3] = 0.0;
    local_178.m_data.m_data[2].m_data[0] = 0.0;
    local_178.m_data.m_data[2].m_data[1] = 0.0;
    local_178.m_data.m_data[1].m_data[2] = 0.0;
    local_178.m_data.m_data[1].m_data[3] = 0.0;
    local_178.m_data.m_data[1].m_data[0] = 0.0;
    local_178.m_data.m_data[1].m_data[1] = 0.0;
    local_178.m_data.m_data[0].m_data[2] = 0.0;
    local_178.m_data.m_data[0].m_data[3] = 0.0;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 4) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 4;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    pdVar26 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_2d8.m_data.m_data[3].m_data[2] = 0.0;
    local_2d8.m_data.m_data[3].m_data[3] = 0.0;
    local_2d8.m_data.m_data[3].m_data[0] = 0.0;
    local_2d8.m_data.m_data[3].m_data[1] = 0.0;
    local_2d8.m_data.m_data[2].m_data[2] = 0.0;
    local_2d8.m_data.m_data[2].m_data[3] = 0.0;
    local_2d8.m_data.m_data[2].m_data[0] = 0.0;
    local_2d8.m_data.m_data[2].m_data[1] = 0.0;
    local_2d8.m_data.m_data[1].m_data[2] = 0.0;
    local_2d8.m_data.m_data[1].m_data[3] = 0.0;
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar40 + lVar47 * 4) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 4;
      pMVar40 = (Matrix<double,_4,_4> *)((long)pMVar40 + 8);
    } while (lVar43 != 4);
    pdVar29 = local_98;
    local_98[0xe] = 0.0;
    local_98[0xf] = 0.0;
    local_98[0xc] = 0.0;
    local_98[0xd] = 0.0;
    local_98[10] = 0.0;
    local_98[0xb] = 0.0;
    local_98[8] = 0.0;
    local_98[9] = 0.0;
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 != 0x80);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pdVar29 = (double *)&local_1f8;
    local_188 = 0;
    uStack_180 = 0;
    local_198 = 0;
    uStack_190 = 0;
    local_1f8.m_data.m_data[2].m_data[2] = 0.0;
    local_1f8.m_data.m_data[2].m_data[3] = 0.0;
    local_1f8.m_data.m_data[2].m_data[0] = 0.0;
    local_1f8.m_data.m_data[2].m_data[1] = 0.0;
    local_1f8.m_data.m_data[1].m_data[2] = 0.0;
    local_1f8.m_data.m_data[1].m_data[3] = 0.0;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 != 0x80);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pVVar24 = (Vector<double,_4> *)&local_1f8;
    pdVar29 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)
         ((long)((Vector<tcu::Vector<double,_4>,_3> *)pVVar24->m_data)->m_data[0].m_data + lVar47) =
             *(undefined8 *)((long)pdVar29 + lVar47 * 4);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      lVar43 = lVar43 + 1;
      pVVar24 = pVVar24 + 1;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_178;
    pdVar28 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47);
        lVar47 = lVar47 + 0x20;
      } while (lVar47 != 0x80);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pdVar28 = pdVar28 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_1f8;
    local_188 = 0;
    uStack_180 = 0;
    local_198 = 0;
    uStack_190 = 0;
    local_1f8.m_data.m_data[2].m_data[2] = 0.0;
    local_1f8.m_data.m_data[2].m_data[3] = 0.0;
    local_1f8.m_data.m_data[2].m_data[0] = 0.0;
    local_1f8.m_data.m_data[2].m_data[1] = 0.0;
    local_1f8.m_data.m_data[1].m_data[2] = 0.0;
    local_1f8.m_data.m_data[1].m_data[3] = 0.0;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 != 0x80);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pVVar24 = (Vector<double,_4> *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)
         ((long)((Vector<tcu::Vector<double,_4>,_3> *)pVVar24->m_data)->m_data[0].m_data + lVar47) =
             *(undefined8 *)((long)pMVar41 + lVar47 * 4);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      lVar43 = lVar43 + 1;
      pVVar24 = pVVar24 + 1;
      pMVar41 = (Matrix<double,_4,_4> *)((long)pMVar41 + 8);
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_1f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar23 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x20;
      } while (lVar47 != 0x80);
      lVar43 = lVar43 + 1;
      pMVar23 = (Matrix<double,_4,_4> *)((long)pMVar23 + 8);
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_1f8;
    tcu::operator*((Matrix<double,_4,_4> *)pdVar29,&local_178,&local_2d8);
    pdVar28 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar28 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x20;
      } while (lVar47 != 0x80);
      lVar43 = lVar43 + 1;
      pdVar28 = pdVar28 + 1;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    pVVar24 = (Vector<double,_4> *)&local_1f8;
    pdVar29 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)
         ((long)((Vector<tcu::Vector<double,_4>,_3> *)pVVar24->m_data)->m_data[0].m_data + lVar47) =
             *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 4;
      pVVar24 = pVVar24 + 1;
    } while (lVar43 != 4);
    pMVar46 = (Matrix<double,_4,_4> *)&local_1f8;
LAB_00954210:
    lVar43 = 0x10;
    goto code_r0x009545f6;
  case VARIABLE_TYPE_DMAT4X2:
    pdVar26 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (double *)&local_178;
    local_178.m_data.m_data[1].m_data[2] = 0.0;
    local_178.m_data.m_data[1].m_data[3] = 0.0;
    local_178.m_data.m_data[1].m_data[0] = 0.0;
    local_178.m_data.m_data[1].m_data[1] = 0.0;
    local_178.m_data.m_data[0].m_data[2] = 0.0;
    local_178.m_data.m_data[0].m_data[3] = 0.0;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 4) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 2;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    local_2d8.m_data.m_data[1].m_data[2] = 0.0;
    local_2d8.m_data.m_data[1].m_data[3] = 0.0;
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pMVar10 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 != 0x40);
      pMVar10 = (Matrix<double,_4,_4> *)((long)pMVar10 + 8);
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar26 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = local_98;
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 2) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      pdVar26 = pdVar26 + 4;
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[1].m_data[2] = 0.0;
    local_1f8.m_data.m_data[1].m_data[3] = 0.0;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 == 0x20);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pdVar29 = (double *)&local_f8;
    local_f8.m_data.m_data[0].m_data[2] = 0.0;
    local_f8.m_data.m_data[1].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 == 0x10);
      pdVar29 = pdVar29 + 1;
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_258;
    local_258.m_data.m_data[1].m_data[2] = 0.0;
    local_258.m_data.m_data[1].m_data[3] = 0.0;
    local_258.m_data.m_data[1].m_data[0] = 0.0;
    local_258.m_data.m_data[1].m_data[1] = 0.0;
    local_258.m_data.m_data[0].m_data[2] = 0.0;
    local_258.m_data.m_data[0].m_data[3] = 0.0;
    local_258.m_data.m_data[0].m_data[0] = 0.0;
    local_258.m_data.m_data[0].m_data[1] = 0.0;
    lVar47 = 0;
    lVar43 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar47 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x10;
      } while (lVar48 != 0x40);
      pdVar29 = pdVar29 + 1;
      lVar47 = lVar47 + 0x10;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_258;
    pdVar28 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47 * 4);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 2;
      pdVar28 = pdVar28 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_258;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar11 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x10;
      } while (lVar47 != 0x40);
      pMVar11 = (Matrix<double,_4,_4> *)((long)pMVar11 + 8);
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_258;
    local_258.m_data.m_data[1].m_data[2] = 0.0;
    local_258.m_data.m_data[1].m_data[3] = 0.0;
    local_258.m_data.m_data[1].m_data[0] = 0.0;
    local_258.m_data.m_data[1].m_data[1] = 0.0;
    local_258.m_data.m_data[0].m_data[2] = 0.0;
    local_258.m_data.m_data[0].m_data[3] = 0.0;
    local_258.m_data.m_data[0].m_data[0] = 0.0;
    local_258.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 == 0x20);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pVVar24 = (Vector<double,_4> *)&local_258;
    pdVar29 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)
         ((long)((Vector<tcu::Vector<double,_4>,_3> *)pVVar24->m_data)->m_data[0].m_data + lVar47) =
             *(undefined8 *)((long)pdVar29 + lVar47 * 2);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x20);
      pVVar24 = pVVar24 + 1;
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pdVar29 = (double *)&local_1f8;
    pdVar28 = (double *)&local_258;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47);
        lVar47 = lVar47 + 0x20;
      } while (lVar47 == 0x20);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pdVar28 = pdVar28 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_258;
    tcu::operator*((Matrix<double,_2,_2> *)pdVar29,(Matrix<double,_2,_4> *)&local_2d8,
                   (Matrix<double,_4,_2> *)&local_1f8);
    pdVar28 = (double *)&local_f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar28 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x10;
      } while (lVar47 == 0x10);
      pdVar28 = pdVar28 + 1;
      pdVar29 = pdVar29 + 1;
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
    pMVar12 = &local_258;
    pdVar29 = (double *)&local_f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)(pMVar12->m_data).m_data[0].m_data + lVar47) =
             *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 == 8);
      pdVar29 = pdVar29 + 2;
      pMVar12 = (Matrix<double,_4,_3> *)((long)(pMVar12->m_data).m_data[0].m_data + lVar47);
      bVar53 = lVar43 == 0;
      lVar43 = lVar43 + 1;
    } while (bVar53);
LAB_00953760:
LAB_00953770:
    *(undefined4 *)(out_result_ptr + 2) = local_258.m_data.m_data[0].m_data[2]._0_4_;
    *(undefined4 *)((long)out_result_ptr + 0x14) = local_258.m_data.m_data[0].m_data[2]._4_4_;
    *(undefined4 *)(out_result_ptr + 3) = local_258.m_data.m_data[0].m_data[3]._0_4_;
    *(undefined4 *)((long)out_result_ptr + 0x1c) = local_258.m_data.m_data[0].m_data[3]._4_4_;
    *(undefined4 *)out_result_ptr = local_258.m_data.m_data[0].m_data[0]._0_4_;
    *(undefined4 *)((long)out_result_ptr + 4) = local_258.m_data.m_data[0].m_data[0]._4_4_;
    *(undefined4 *)(out_result_ptr + 1) = local_258.m_data.m_data[0].m_data[1]._0_4_;
    *(undefined4 *)((long)out_result_ptr + 0xc) = local_258.m_data.m_data[0].m_data[1]._4_4_;
    return;
  case VARIABLE_TYPE_DMAT4X3:
    pdVar26 = (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (double *)&local_178;
    local_178.m_data.m_data[2].m_data[2] = 0.0;
    local_178.m_data.m_data[2].m_data[3] = 0.0;
    local_178.m_data.m_data[2].m_data[0] = 0.0;
    local_178.m_data.m_data[2].m_data[1] = 0.0;
    local_178.m_data.m_data[1].m_data[2] = 0.0;
    local_178.m_data.m_data[1].m_data[3] = 0.0;
    local_178.m_data.m_data[1].m_data[0] = 0.0;
    local_178.m_data.m_data[1].m_data[1] = 0.0;
    local_178.m_data.m_data[0].m_data[2] = 0.0;
    local_178.m_data.m_data[0].m_data[3] = 0.0;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47 * 4) = *(undefined8 *)((long)pdVar26 + lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 3;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 4);
    local_2d8.m_data.m_data[2].m_data[2] = 0.0;
    local_2d8.m_data.m_data[2].m_data[3] = 0.0;
    local_2d8.m_data.m_data[2].m_data[0] = 0.0;
    local_2d8.m_data.m_data[2].m_data[1] = 0.0;
    local_2d8.m_data.m_data[1].m_data[2] = 0.0;
    local_2d8.m_data.m_data[1].m_data[3] = 0.0;
    local_2d8.m_data.m_data[1].m_data[0] = 0.0;
    local_2d8.m_data.m_data[1].m_data[1] = 0.0;
    local_2d8.m_data.m_data[0].m_data[2] = 0.0;
    local_2d8.m_data.m_data[0].m_data[3] = 0.0;
    local_2d8.m_data.m_data[0].m_data[0] = 0.0;
    local_2d8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pMVar25 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 != 0x60);
      lVar47 = lVar47 + 1;
      pMVar25 = (Matrix<double,_4,_4> *)((long)pMVar25 + 8);
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar26 = (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = local_98;
    local_98[10] = 0.0;
    local_98[0xb] = 0.0;
    local_98[8] = 0.0;
    local_98[9] = 0.0;
    local_98[6] = 0.0;
    local_98[7] = 0.0;
    local_98[4] = 0.0;
    local_98[5] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar28 = pdVar29;
      do {
        *pdVar28 = pdVar26[lVar47];
        lVar47 = lVar47 + 1;
        pdVar28 = pdVar28 + 3;
      } while (lVar47 != 4);
      lVar43 = lVar43 + 1;
      pdVar26 = pdVar26 + 4;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_1f8;
    local_1f8.m_data.m_data[2].m_data[2] = 0.0;
    local_1f8.m_data.m_data[2].m_data[3] = 0.0;
    local_1f8.m_data.m_data[2].m_data[0] = 0.0;
    local_1f8.m_data.m_data[2].m_data[1] = 0.0;
    local_1f8.m_data.m_data[1].m_data[2] = 0.0;
    local_1f8.m_data.m_data[1].m_data[3] = 0.0;
    local_1f8.m_data.m_data[1].m_data[0] = 0.0;
    local_1f8.m_data.m_data[1].m_data[1] = 0.0;
    local_1f8.m_data.m_data[0].m_data[2] = 0.0;
    local_1f8.m_data.m_data[0].m_data[3] = 0.0;
    local_1f8.m_data.m_data[0].m_data[0] = 0.0;
    local_1f8.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 != 0x60);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pdVar29 = (double *)&local_f8;
    local_f8.m_data.m_data[2].m_data[0] = 0.0;
    local_f8.m_data.m_data[2].m_data[1] = 0.0;
    local_f8.m_data.m_data[1].m_data[1] = 0.0;
    local_f8.m_data.m_data[1].m_data[2] = 0.0;
    local_f8.m_data.m_data[0].m_data[2] = 0.0;
    local_f8.m_data.m_data[1].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[0] = 0.0;
    local_f8.m_data.m_data[0].m_data[1] = 0.0;
    local_f8.m_data.m_data[2].m_data[2] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 != 0x48);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = (double *)&local_258;
    local_258.m_data.m_data[2].m_data[2] = 0.0;
    local_258.m_data.m_data[2].m_data[3] = 0.0;
    local_258.m_data.m_data[2].m_data[0] = 0.0;
    local_258.m_data.m_data[2].m_data[1] = 0.0;
    local_258.m_data.m_data[1].m_data[2] = 0.0;
    local_258.m_data.m_data[1].m_data[3] = 0.0;
    local_258.m_data.m_data[1].m_data[0] = 0.0;
    local_258.m_data.m_data[1].m_data[1] = 0.0;
    local_258.m_data.m_data[0].m_data[2] = 0.0;
    local_258.m_data.m_data[0].m_data[3] = 0.0;
    local_258.m_data.m_data[0].m_data[0] = 0.0;
    local_258.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x18;
      } while (lVar48 != 0x60);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x18;
    } while (lVar47 != 3);
    pdVar29 = (double *)&local_258;
    pdVar28 = (double *)&local_178;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47 * 4);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 3;
      pdVar28 = pdVar28 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_258;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pMVar27 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 != 0x60);
      lVar43 = lVar43 + 1;
      pMVar27 = (Matrix<double,_4,_4> *)((long)pMVar27 + 8);
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_258;
    local_258.m_data.m_data[2].m_data[2] = 0.0;
    local_258.m_data.m_data[2].m_data[3] = 0.0;
    local_258.m_data.m_data[2].m_data[0] = 0.0;
    local_258.m_data.m_data[2].m_data[1] = 0.0;
    local_258.m_data.m_data[1].m_data[2] = 0.0;
    local_258.m_data.m_data[1].m_data[3] = 0.0;
    local_258.m_data.m_data[1].m_data[0] = 0.0;
    local_258.m_data.m_data[1].m_data[1] = 0.0;
    local_258.m_data.m_data[0].m_data[2] = 0.0;
    local_258.m_data.m_data[0].m_data[3] = 0.0;
    local_258.m_data.m_data[0].m_data[0] = 0.0;
    local_258.m_data.m_data[0].m_data[1] = 0.0;
    lVar43 = 0;
    lVar47 = 0;
    do {
      lVar48 = 0;
      do {
        uVar55 = 0x3ff00000;
        if (lVar43 != lVar48) {
          uVar55 = 0;
        }
        *(ulong *)((long)pdVar29 + lVar48) = (ulong)uVar55 << 0x20;
        lVar48 = lVar48 + 0x20;
      } while (lVar48 != 0x60);
      lVar47 = lVar47 + 1;
      pdVar29 = pdVar29 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar47 != 4);
    pVVar24 = (Vector<double,_4> *)&local_258;
    pdVar29 = local_98;
    lVar43 = 0;
    do {
      lVar47 = 0;
      pdVar28 = pdVar29;
      do {
        ((Vector<tcu::Vector<double,_4>,_3> *)pVVar24->m_data)->m_data[0].m_data[lVar47] = *pdVar28;
        lVar47 = lVar47 + 1;
        pdVar28 = pdVar28 + 3;
      } while (lVar47 != 4);
      lVar43 = lVar43 + 1;
      pVVar24 = pVVar24 + 1;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_1f8;
    pdVar28 = (double *)&local_258;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) = *(undefined8 *)((long)pdVar28 + lVar47);
        lVar47 = lVar47 + 0x20;
      } while (lVar47 != 0x60);
      lVar43 = lVar43 + 1;
      pdVar29 = pdVar29 + 1;
      pdVar28 = pdVar28 + 1;
    } while (lVar43 != 4);
    pdVar29 = (double *)&local_258;
    tcu::operator*((Matrix<double,_3,_3> *)pdVar29,(Matrix<double,_3,_4> *)&local_2d8,&local_1f8);
    pdVar28 = (double *)&local_f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar28 + lVar47) = *(undefined8 *)((long)pdVar29 + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 != 0x48);
      lVar43 = lVar43 + 1;
      pdVar28 = pdVar28 + 1;
      pdVar29 = pdVar29 + 1;
    } while (lVar43 != 3);
    pdVar29 = (double *)&local_258;
    pVVar42 = (Vector<double,_3> *)&local_f8;
    lVar43 = 0;
    do {
      lVar47 = 0;
      do {
        *(undefined8 *)((long)pdVar29 + lVar47) =
             *(undefined8 *)
              ((long)((Vector<tcu::Vector<double,_3>,_4> *)pVVar42->m_data)->m_data[0].m_data +
              lVar47);
        lVar47 = lVar47 + 8;
      } while (lVar47 != 0x18);
      lVar43 = lVar43 + 1;
      pVVar42 = pVVar42 + 1;
      pdVar29 = pdVar29 + 3;
    } while (lVar43 != 3);
    pMVar49 = (Matrix<double,_4,_4> *)&local_258;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized matrix A type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x2c2e);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  lVar43 = 9;
  pMVar46 = pMVar49;
code_r0x009545f6:
  for (; lVar43 != 0; lVar43 = lVar43 + -1) {
    *out_result_ptr = (((Matrix<double,_4,_3> *)pMVar46)->m_data).m_data[0].m_data[0];
    pMVar46 = (Matrix<double,_4,_4> *)((long)pMVar46 + ((ulong)bVar54 * -2 + 1) * 8);
    out_result_ptr = out_result_ptr + (ulong)bVar54 * -2 + 1;
  }
  return;
}

Assistant:

void GPUShaderFP64Test9::getMatrixMultiplicationResult(const Utils::_variable_type& matrix_a_type,
													   const std::vector<double>&   matrix_a_data,
													   const Utils::_variable_type& matrix_b_type,
													   const std::vector<double>& matrix_b_data, double* out_result_ptr)
{
	(void)matrix_b_type;
	using namespace tcu;
	/* To keep the code maintainable, we only consider cases relevant for this test */
	switch (matrix_a_type)
	{
	case Utils::VARIABLE_TYPE_DMAT2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2);

		tcu::Matrix2d matrix_a(&matrix_a_data[0]);
		tcu::Matrix2d matrix_b(&matrix_b_data[0]);
		tcu::Matrix2d result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT2X3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3X2);

		tcu::Matrix<double, 2, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 2> matrix_a_transposed;
		tcu::Matrix<double, 3, 2> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 2, 3> matrix_b_transposed;
		tcu::Matrix<double, 3, 3> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT2X4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4X2);

		tcu::Matrix<double, 2, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 2> matrix_a_transposed;
		tcu::Matrix<double, 4, 2> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 2, 4> matrix_b_transposed;
		tcu::Matrix<double, 4, 4> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3);

		tcu::Matrix<double, 3, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 3> result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3X2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2X3);

		tcu::Matrix<double, 3, 2> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 2, 3> matrix_a_transposed;
		tcu::Matrix<double, 2, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 2> matrix_b_transposed;
		tcu::Matrix<double, 2, 2> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3X4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4X3);

		tcu::Matrix<double, 3, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 3> matrix_a_transposed;
		tcu::Matrix<double, 4, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 4> matrix_b_transposed;
		tcu::Matrix<double, 4, 4> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4);

		tcu::Matrix<double, 4, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 4> result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4X2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2X4);

		tcu::Matrix<double, 4, 2> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 2, 4> matrix_a_transposed;
		tcu::Matrix<double, 2, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 2> matrix_b_transposed;
		tcu::Matrix<double, 2, 2> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4X3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3X4);

		tcu::Matrix<double, 4, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 4> matrix_a_transposed;
		tcu::Matrix<double, 3, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 3> matrix_b_transposed;
		tcu::Matrix<double, 3, 3> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized matrix A type");
	}
	} /* switch (matrix_a_type) */
}